

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixCaseBlocks
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool
               *blockContentGenerator)

{
  bool bVar1;
  MatrixOrder MVar2;
  Node *ptr;
  StorageQualifier *this;
  TestNode *node;
  LayoutQualifier *this_00;
  InterfaceBlock *this_01;
  byte bVar3;
  long lVar4;
  SharedPtr subStructure;
  SharedPtr uniform;
  Layout layout;
  SharedPtr defaultBlock;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_40;
  
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,ptr);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,&defaultBlock,STORAGE_UNIFORM);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&uniform,(Node *)this);
  for (lVar4 = 0x14; lVar4 != 0xbc; lVar4 = lVar4 + 0x18) {
    subStructure.m_ptr = uniform.m_ptr;
    subStructure.m_state = uniform.m_state;
    if (uniform.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (uniform.m_state)->strongRefCount = (uniform.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (uniform.m_state)->weakRefCount = (uniform.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,context->m_testCtx,
               *(char **)((long)&PTR_typeinfo_name_01e5ba68 + lVar4 + 4),
               *(char **)((long)&PTR_typeinfo_01e5ba70 + lVar4 + 4));
    bVar1 = (bool)(&UNK_01e5ba7e)[lVar4];
    if (bVar1 == true) {
      bVar3 = (&UNK_01e5ba7c)[lVar4] ^ 1;
    }
    else {
      bVar3 = false;
    }
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    MVar2 = *(MatrixOrder *)((long)&generateUniformMatrixCaseBlocks::children[0].name + lVar4);
    if (MVar2 != MATRIXORDER_LAST) {
      glu::Layout::Layout(&layout,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      layout.matrixOrder = MVar2;
      this_00 = (LayoutQualifier *)operator_new(0x38);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(this_00,&subStructure,&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_40,(Node *)this_00);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=(&subStructure,&local_40);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_40);
    }
    if ((&UNK_01e5ba7c)[lVar4] == '\x01') {
      this_01 = (InterfaceBlock *)operator_new(0x28);
      ResourceDefinition::InterfaceBlock::InterfaceBlock
                (this_01,&subStructure,(bool)(&UNK_01e5ba7d)[lVar4]);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&layout,(Node *)this_01);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=(&subStructure,
                  (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&layout);
    }
    (*blockContentGenerator)(context,&subStructure,(TestCaseGroup *)node,bVar1,(bool)bVar3);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&subStructure);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&uniform);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  return;
}

Assistant:

static void generateUniformMatrixCaseBlocks (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, bool, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				block;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "default_block",				"Default block",			false,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block",				"Named uniform block",		true,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr uniform		(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_UNIFORM));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	subStructure	= uniform;
		tcu::TestCaseGroup* const			blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), children[childNdx].name, children[childNdx].description);
		const bool							addOpaqueCases	= children[childNdx].extendedBasicTypeCases && !children[childNdx].block;

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
		}

		if (children[childNdx].block)
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(subStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, subStructure, blockGroup, children[childNdx].extendedBasicTypeCases, addOpaqueCases);
	}
}